

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<float,_std::allocator<float>_> *
readFromSep<float>(vector<float,_std::allocator<float>_> *__return_storage_ptr__,char *cdata,
                  char sep)

{
  double dVar1;
  char cVar2;
  ulong uVar3;
  float local_2c;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar2 = *cdata;
  uVar3 = 0;
  do {
    if (cVar2 == '\0') {
      return __return_storage_ptr__;
    }
    dVar1 = atof(cdata + uVar3);
    local_2c = (float)dVar1;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (__return_storage_ptr__,&local_2c);
    do {
      uVar3 = (ulong)((int)uVar3 + 1);
      cVar2 = cdata[uVar3];
      if (cVar2 == '\0') break;
    } while (cVar2 != sep);
  } while( true );
}

Assistant:

vector<T> readFromSep(const char * cdata, char sep=' ') {
    vector<T> arr;
    unsigned int begin = 0;
    while (cdata[begin] != '\0') {
        arr.push_back((float)atof(cdata + begin));
        ++begin;
        while (cdata[begin] != '\0' && cdata[begin] != sep) {
            ++begin;
        }
    }
    return arr;
}